

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.c
# Opt level: O1

int main(void)

{
  FILE *__stream;
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int i;
  uint uVar9;
  int i_4;
  uint8_t b;
  uint8_t a;
  char *__ptr;
  int i_2;
  bool bVar10;
  uint uVar11;
  bool bVar12;
  size_t __size;
  char local_238 [256];
  char seenl [256];
  
  fwrite("Test: test_add\n",0xf,1,_stderr);
  uVar9 = 1;
  uVar1 = gf256_add('\x01','\x01');
  if (uVar1 == '\0') {
    uVar1 = gf256_add(0x85,0x85);
    if (uVar1 != '\0') goto LAB_001010e4;
    uVar1 = gf256_add('5','{');
    bVar12 = uVar1 == 'N';
  }
  else {
LAB_001010e4:
    bVar12 = false;
  }
  if (bVar12 == false) {
    __ptr = "--> FAIL (test test_add)\n";
    __size = 0x19;
  }
  else {
    __ptr = "--> pass\n";
    __size = 9;
  }
  fwrite(__ptr,__size,1,_stderr);
  fwrite("Test: test_logexp\n",0x12,1,_stderr);
  bVar10 = true;
  do {
    uVar5 = gf256_log((uint8_t)uVar9);
    if (0xff < uVar5) {
      bVar10 = false;
      fprintf(_stderr,"  gf256_log(%d): got %d\n",(ulong)uVar9,(ulong)uVar5);
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x100);
  uVar9 = 0;
  do {
    uVar1 = gf256_exp(uVar9);
    if (uVar1 == '\0') {
      bVar10 = false;
      fprintf(_stderr,"  gf256_exp(%d) == 0 !\n",(ulong)uVar9);
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0xff);
  uVar9 = 1;
  do {
    iVar6 = gf256_log((uint8_t)uVar9);
    bVar2 = gf256_exp(iVar6);
    if (uVar9 != bVar2) {
      bVar10 = false;
      fprintf(_stderr,"  gf256_exp(gf256_log(%d)) == %d !\n",(ulong)uVar9);
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x100);
  if (bVar10) {
    fwrite("--> pass\n",9,1,_stderr);
    uVar9 = (uint)(bVar12 ^ 1);
  }
  else {
    fwrite("--> FAIL (test test_logexp)\n",0x1c,1,_stderr);
    uVar9 = 1;
  }
  fwrite("Test: test_mul\n",0xf,1,_stderr);
  uVar1 = gf256_mul('\0','\0');
  if (uVar1 == '\0') {
    uVar1 = gf256_mul('\x1a','\0');
    if (uVar1 == '\0') {
      uVar1 = gf256_mul('\0',0x8f);
      bVar12 = true;
      if (uVar1 == '\0') goto LAB_0010126e;
    }
  }
  fwrite("  nonzero result from 0*x or x*0.\n",0x22,1,_stderr);
  bVar12 = false;
LAB_0010126e:
  uVar5 = 0;
  do {
    bVar2 = gf256_mul('\x01',(uint8_t)uVar5);
    bVar3 = gf256_mul((uint8_t)uVar5,'\x01');
    if (uVar5 != bVar2) {
      bVar12 = false;
      fprintf(_stderr,"  1 * %d == %d !\n",(ulong)uVar5,(ulong)(uint)bVar2);
    }
    if (uVar5 != bVar3) {
      bVar12 = false;
      fprintf(_stderr,"  1 * %d == %d !\n",(ulong)uVar5);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x100);
  uVar5 = 0;
  do {
    iVar6 = 8;
    uVar7 = uVar5;
    do {
      bVar2 = gf256_mul((uint8_t)uVar7,(uint8_t)uVar7);
      uVar7 = (uint)bVar2;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    if (uVar5 != bVar2) {
      bVar12 = false;
      fprintf(_stderr,"  %d^256 == %d\n",(ulong)uVar5);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x100);
  iVar6 = 0;
  memset(seenl,0,0x100);
  memset(local_238,0,0x100);
  do {
    bVar2 = gf256_mul('9',(uint8_t)iVar6);
    bVar3 = gf256_mul((uint8_t)iVar6,0xb9);
    if ((seenl[bVar2] != '\0') || (local_238[bVar3] != '\0')) {
      fwrite(" x |-> cst * x is not one-on-one\n",0x21,1,_stderr);
      bVar12 = false;
    }
    seenl[bVar2] = '\x01';
    local_238[bVar3] = '\x01';
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x100);
  iVar6 = 100;
  do {
    uVar5 = rand();
    uVar7 = rand();
    b = (uint8_t)uVar7;
    a = (uint8_t)uVar5;
    uVar1 = gf256_mul(a,b);
    uVar4 = gf256_mul(b,a);
    __stream = _stderr;
    if (uVar1 != uVar4) {
      bVar2 = gf256_mul(a,b);
      bVar3 = gf256_mul(b,a);
      bVar12 = false;
      fprintf(__stream,"  %d * %d = %d, but %d * %d = %d\n",(ulong)(uVar5 & 0xff),
              (ulong)(uVar7 & 0xff),(ulong)bVar2,(ulong)(uVar7 & 0xff),(ulong)(uVar5 & 0xff),
              (ulong)bVar3);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 100;
  do {
    uVar5 = rand();
    uVar7 = rand();
    uVar8 = rand();
    uVar1 = gf256_mul((uint8_t)uVar5,(uint8_t)uVar7);
    bVar2 = gf256_mul(uVar1,(uint8_t)uVar8);
    uVar1 = gf256_mul((uint8_t)uVar7,(uint8_t)uVar8);
    bVar3 = gf256_mul((uint8_t)uVar5,uVar1);
    if (bVar2 != bVar3) {
      bVar12 = false;
      fprintf(_stderr,"  (%d * %d) * %d == %d, but %d * (%d * %d) == %d\n",(ulong)(uVar5 & 0xff),
              (ulong)(uVar7 & 0xff),(ulong)(uVar8 & 0xff),(ulong)bVar2,(ulong)(uVar5 & 0xff),
              (ulong)(uVar7 & 0xff),(ulong)(uVar8 & 0xff),(ulong)bVar3);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  iVar6 = 100;
  do {
    uVar5 = rand();
    uVar7 = rand();
    uVar8 = rand();
    uVar1 = gf256_add((uint8_t)uVar7,(uint8_t)uVar8);
    uVar11 = uVar5 & 0xff;
    uVar4 = (uint8_t)uVar5;
    bVar2 = gf256_mul(uVar4,uVar1);
    uVar1 = gf256_mul(uVar4,(uint8_t)uVar7);
    uVar4 = gf256_mul(uVar4,(uint8_t)uVar8);
    bVar3 = gf256_add(uVar1,uVar4);
    if (bVar2 != bVar3) {
      bVar12 = false;
      fprintf(_stderr,"  %d * (%d + %d) = %d, but %d * %d + %d * %d = %d\n",(ulong)uVar11,
              (ulong)(uVar7 & 0xff),(ulong)(uVar8 & 0xff),(ulong)bVar2,(ulong)uVar11,
              (ulong)(uVar7 & 0xff),(ulong)uVar11,(ulong)(uVar8 & 0xff),(ulong)bVar3);
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  if (bVar12) {
    fwrite("--> pass\n",9,1,_stderr);
  }
  else {
    fwrite("--> FAIL (test test_mul)\n",0x19,1,_stderr);
    uVar9 = 1;
  }
  uVar5 = 1;
  fwrite("Test: test_inv\n",0xf,1,_stderr);
  bVar12 = true;
  do {
    uVar1 = gf256_inv((uint8_t)uVar5);
    bVar2 = gf256_mul((uint8_t)uVar5,uVar1);
    if (bVar2 != 1) {
      bVar12 = false;
      fprintf(_stderr,"  %d * ~%d == %d\n",(ulong)uVar5,(ulong)uVar5,(ulong)bVar2);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x100);
  uVar5 = 1;
  do {
    uVar1 = gf256_inv((uint8_t)uVar5);
    bVar2 = gf256_inv(uVar1);
    if (uVar5 != bVar2) {
      bVar12 = false;
      fprintf(_stderr,"  ~~%d = %d.\n",(ulong)uVar5);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x100);
  if (bVar12) {
    fwrite("--> pass\n",9,1,_stderr);
  }
  else {
    fwrite("--> FAIL (test test_inv)\n",0x19,1,_stderr);
    uVar9 = 1;
  }
  return uVar9;
}

Assistant:

int main()
{
	int nfail = 0;
#define RUN_TEST(x) \
	do { \
		fprintf(stderr, "Test: " #x "\n"); \
		if (!x()) { \
			fprintf(stderr, "--> FAIL (test " #x ")\n"); \
			++nfail; \
		} else { \
			fprintf(stderr, "--> pass\n"); \
		} \
	} while(0)

	RUN_TEST(test_add);
	RUN_TEST(test_logexp);
	RUN_TEST(test_mul);
	RUN_TEST(test_inv);

#undef RUN_TEST
	return (nfail == 0 ? EXIT_SUCCESS : EXIT_FAILURE);
}